

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

void __thiscall
icu_63::VTimeZone::writeZonePropsByTime
          (VTimeZone *this,VTZWriter *writer,UBool isDst,UnicodeString *zonename,int32_t fromOffset,
          int32_t toOffset,UDate time,UBool withRDATE,UErrorCode *status)

{
  UnicodeString timestr;
  undefined1 local_68 [64];
  
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     (beginZoneProps(this,writer,isDst,zonename,fromOffset,toOffset,time,status),
     *status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (withRDATE != '\0') {
      UnicodeString::doAppend(writer->out,(UChar *)ICAL_RDATE,0,-1);
      local_68._0_2_ = 0x3a;
      UnicodeString::doAppend(writer->out,(UChar *)local_68,0,1);
      local_68._0_8_ = &PTR__UnicodeString_003febe0;
      local_68._8_2_ = 2;
      getDateTimeString((double)fromOffset + time,(UnicodeString *)local_68);
      if (-1 < (short)local_68._8_2_) {
        local_68._12_4_ = (int)(short)local_68._8_2_ >> 5;
      }
      UnicodeString::doAppend(writer->out,(UnicodeString *)local_68,0,local_68._12_4_);
      UnicodeString::doAppend(writer->out,L"\r\n",0,-1);
      this = (VTimeZone *)local_68;
      UnicodeString::~UnicodeString((UnicodeString *)this);
    }
    endZoneProps(this,writer,isDst,status);
  }
  return;
}

Assistant:

void
VTimeZone::writeZonePropsByTime(VTZWriter& writer, UBool isDst, const UnicodeString& zonename,
                                int32_t fromOffset, int32_t toOffset, UDate time, UBool withRDATE,
                                UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    beginZoneProps(writer, isDst, zonename, fromOffset, toOffset, time, status);
    if (U_FAILURE(status)) {
        return;
    }
    if (withRDATE) {
        writer.write(ICAL_RDATE);
        writer.write(COLON);
        UnicodeString timestr;
        writer.write(getDateTimeString(time + fromOffset, timestr));
        writer.write(ICAL_NEWLINE);
    }
    endZoneProps(writer, isDst, status);
    if (U_FAILURE(status)) {
        return;
    }
}